

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsRoberts_ASAi_dns.c
# Opt level: O1

void PrintOutput1(sunrealtype time,sunrealtype t,N_Vector y,N_Vector yB)

{
  undefined8 *puVar1;
  
  puts("--------------------------------------------------------");
  printf("returned t: %12.4e\n",time);
  printf("tout:       %12.4e\n",0x4044000000000000);
  puVar1 = *(undefined8 **)((long)yB->content + 0x10);
  printf("lambda(t):  %12.4e %12.4e %12.4e\n",*puVar1,puVar1[1],puVar1[2]);
  puVar1 = *(undefined8 **)((long)y->content + 0x10);
  printf("y(t):       %12.4e %12.4e %12.4e\n",*puVar1,puVar1[1],puVar1[2]);
  puts("--------------------------------------------------------");
  return;
}

Assistant:

static void PrintOutput1(sunrealtype time, sunrealtype t, N_Vector y, N_Vector yB)
{
  printf("--------------------------------------------------------\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("returned t: %12.4Le\n", time);
  printf("tout:       %12.4Le\n", t);
  printf("lambda(t):  %12.4Le %12.4Le %12.4Le\n", Ith(yB, 1), Ith(yB, 2),
         Ith(yB, 3));
  printf("y(t):       %12.4Le %12.4Le %12.4Le\n", Ith(y, 1), Ith(y, 2),
         Ith(y, 3));
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("returned t: %12.4e\n", time);
  printf("tout:       %12.4e\n", t);
  printf("lambda(t):  %12.4e %12.4e %12.4e\n", Ith(yB, 1), Ith(yB, 2),
         Ith(yB, 3));
  printf("y(t):       %12.4e %12.4e %12.4e\n", Ith(y, 1), Ith(y, 2), Ith(y, 3));
#else
  printf("returned t: %12.4e\n", time);
  printf("tout:       %12.4e\n", t);
  printf("lambda(t):  %12.4e %12.4e %12.4e\n", Ith(yB, 1), Ith(yB, 2),
         Ith(yB, 3));
  printf("y(t)      : %12.4e %12.4e %12.4e\n", Ith(y, 1), Ith(y, 2), Ith(y, 3));
#endif
  printf("--------------------------------------------------------\n");
}